

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::anon_unknown_130::
     genericInitTestMessage<capnproto_test::capnp::test::TestAllTypes::Builder>(Builder builder)

{
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> init;
  initializer_list<capnp::Data::Reader> init_00;
  initializer_list<capnp::Text::Reader> init_01;
  initializer_list<double> init_02;
  initializer_list<float> init_03;
  initializer_list<unsigned_long> init_04;
  initializer_list<unsigned_int> init_05;
  initializer_list<unsigned_short> init_06;
  initializer_list<unsigned_char> init_07;
  initializer_list<long> init_08;
  initializer_list<int> init_09;
  initializer_list<short> init_10;
  initializer_list<signed_char> init_11;
  initializer_list<bool> init_12;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> init_13;
  initializer_list<capnp::Data::Reader> init_14;
  initializer_list<capnp::Text::Reader> init_15;
  initializer_list<double> init_16;
  initializer_list<float> init_17;
  initializer_list<unsigned_long> init_18;
  initializer_list<unsigned_int> init_19;
  initializer_list<unsigned_short> init_20;
  initializer_list<unsigned_char> init_21;
  initializer_list<long> init_22;
  initializer_list<int> init_23;
  initializer_list<short> init_24;
  initializer_list<signed_char> init_25;
  initializer_list<bool> init_26;
  initializer_list<capnp::Void> init_27;
  Builder *__tagb;
  double dVar1;
  TestEnum_9c8e9318b29d9cd3 local_87c [2];
  iterator local_878;
  undefined8 local_870;
  ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_868;
  ArrayPtr<const_char> local_858;
  Builder local_848;
  ArrayPtr<const_char> local_820;
  Builder local_810;
  ArrayPtr<const_char> local_7e8;
  Builder local_7d8;
  undefined1 local_7b0 [8];
  Builder listBuilder_1;
  ArrayPtr<const_capnp::Data::Reader> local_748;
  Reader local_738;
  Reader RStack_728;
  Reader RStack_718;
  iterator local_708;
  undefined8 local_700;
  ArrayPtr<const_capnp::Text::Reader> local_6f8;
  double local_6e8 [4];
  iterator local_6c8;
  undefined8 local_6c0;
  ArrayPtr<const_double> local_6b8;
  float local_6a8;
  float local_6a4;
  float local_6a0;
  undefined4 local_69c;
  iterator local_698;
  undefined8 local_690;
  ArrayPtr<const_float> local_688;
  unsigned_long local_678;
  iterator local_670;
  undefined8 local_668;
  ArrayPtr<const_unsigned_long> local_660;
  uint local_64c;
  iterator local_648;
  undefined8 local_640;
  ArrayPtr<const_unsigned_int> local_638;
  unsigned_short local_624 [2];
  iterator local_620;
  undefined8 local_618;
  ArrayPtr<const_unsigned_short> local_610;
  uchar local_5fa [2];
  iterator local_5f8;
  undefined8 local_5f0;
  ArrayPtr<const_unsigned_char> local_5e8;
  long local_5d8 [2];
  iterator local_5c8;
  undefined8 local_5c0;
  ArrayPtr<const_long> local_5b8;
  int local_5a8 [2];
  iterator local_5a0;
  undefined8 local_598;
  ArrayPtr<const_int> local_590;
  short local_57c [2];
  iterator local_578;
  undefined8 local_570;
  ArrayPtr<const_short> local_568;
  char local_552 [2];
  iterator local_550;
  undefined8 local_548;
  ArrayPtr<const_signed_char> local_540;
  bool local_52c [4];
  iterator local_528;
  undefined8 local_520;
  ArrayPtr<const_bool> local_518;
  Builder local_508;
  TestEnum_9c8e9318b29d9cd3 local_4de [3];
  iterator local_4d8;
  undefined8 local_4d0;
  ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3> local_4c8;
  ArrayPtr<const_char> local_4b8;
  Builder local_4a8;
  ArrayPtr<const_char> local_480;
  Builder local_470;
  ArrayPtr<const_char> local_448;
  Builder local_438;
  undefined1 local_410 [8];
  Builder listBuilder;
  ArrayPtr<const_capnp::Data::Reader> local_3a8;
  Reader local_398;
  Reader RStack_388;
  Reader RStack_378;
  iterator local_368;
  undefined8 local_360;
  ArrayPtr<const_capnp::Text::Reader> local_358;
  double local_348 [6];
  iterator local_318;
  undefined8 local_310;
  ArrayPtr<const_double> local_308;
  float local_2f8 [6];
  iterator local_2e0;
  undefined8 local_2d8;
  ArrayPtr<const_float> local_2d0;
  unsigned_long local_2c0 [4];
  iterator local_2a0;
  undefined8 local_298;
  ArrayPtr<const_unsigned_long> local_290;
  uint local_280 [4];
  iterator local_270;
  undefined8 local_268;
  ArrayPtr<const_unsigned_int> local_260;
  unsigned_short local_250 [4];
  iterator local_248;
  undefined8 local_240;
  ArrayPtr<const_unsigned_short> local_238;
  uchar local_224 [4];
  iterator local_220;
  undefined8 local_218;
  ArrayPtr<const_unsigned_char> local_210;
  long local_200 [4];
  iterator local_1e0;
  undefined8 local_1d8;
  ArrayPtr<const_long> local_1d0;
  int local_1c0 [4];
  iterator local_1b0;
  undefined8 local_1a8;
  ArrayPtr<const_int> local_1a0;
  short local_190 [4];
  iterator local_188;
  undefined8 local_180;
  ArrayPtr<const_short> local_178;
  char local_164 [4];
  iterator local_160;
  undefined8 local_158;
  ArrayPtr<const_signed_char> local_150;
  bool local_13d [5];
  iterator local_138;
  undefined8 local_130;
  ArrayPtr<const_bool> local_128;
  Void local_113 [3];
  iterator local_110;
  undefined8 local_108;
  ArrayPtr<const_capnp::Void> local_100;
  ArrayPtr<const_char> local_f0;
  Builder local_e0;
  ArrayPtr<const_char> local_b8;
  undefined1 local_a8 [8];
  Builder subSubBuilder;
  ArrayPtr<const_char> local_70;
  undefined1 local_58 [8];
  Builder subBuilder;
  ArrayPtr<const_char> local_20;
  
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidField();
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidField((Builder *)&stack0x00000008);
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolField((Builder *)&stack0x00000008,true)
  ;
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8Field
            ((Builder *)&stack0x00000008,-0x7b);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16Field
            ((Builder *)&stack0x00000008,-0x3039);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field
            ((Builder *)&stack0x00000008,-0xbc614e);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64Field
            ((Builder *)&stack0x00000008,-0x7048860ddf79);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8Field
            ((Builder *)&stack0x00000008,0xea);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16Field
            ((Builder *)&stack0x00000008,0xb26e);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32Field
            ((Builder *)&stack0x00000008,0xce0a6a14);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64Field
            ((Builder *)&stack0x00000008,0xab54a98ceb1f0ad2);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32Field
            ((Builder *)&stack0x00000008,1234.5);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64Field
            ((Builder *)&stack0x00000008,-1.23e+47);
  Text::Reader::Reader((Reader *)&local_20,"foo");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)&stack0x00000008,(Reader)local_20);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("bar");
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField
            ((Builder *)&stack0x00000008,(Reader)join_0x00000010_0x00000000_);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)local_58,(Builder *)&stack0x00000008);
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidField((Builder *)local_58);
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolField((Builder *)local_58,true);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8Field((Builder *)local_58,-0xc);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16Field((Builder *)local_58,0xd80);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32Field((Builder *)local_58,-0x4b3eff2);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64Field
            ((Builder *)local_58,0x33a638e8734e);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8Field((Builder *)local_58,'Z');
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16Field((Builder *)local_58,0x4d2);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32Field((Builder *)local_58,0x3628814);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64Field
            ((Builder *)local_58,0x4cc1921126f0ad2);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32Field((Builder *)local_58,-1.25e-10)
  ;
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64Field((Builder *)local_58,345.0);
  Text::Reader::Reader((Reader *)&local_70,"baz");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_58,(Reader)local_70);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("qux");
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataField
            ((Builder *)local_58,(Reader)join_0x00000010_0x00000000_);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField
            ((Builder *)local_a8,(Builder *)local_58);
  Text::Reader::Reader((Reader *)&local_b8,"nested");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField
            ((Builder *)local_a8,(Reader)local_b8);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructField(&local_e0,(Builder *)local_a8)
  ;
  Text::Reader::Reader((Reader *)&local_f0,"really nested");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_e0,(Reader)local_f0);
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumField((Builder *)local_58,BAZ);
  local_110 = local_113;
  local_108 = 3;
  init_27._M_len = 3;
  init_27._M_array = local_110;
  kj::ArrayPtr<const_capnp::Void>::ArrayPtr(&local_100,init_27);
  capnproto_test::capnp::test::TestAllTypes::Builder::setVoidList((Builder *)local_58,local_100);
  local_13d[0] = false;
  local_13d[1] = true;
  local_13d[2] = false;
  local_13d[3] = true;
  local_13d[4] = true;
  local_138 = local_13d;
  local_130 = 5;
  init_26._M_len = 5;
  init_26._M_array = local_138;
  kj::ArrayPtr<const_bool>::ArrayPtr(&local_128,init_26);
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList((Builder *)local_58,local_128);
  builtin_strncpy(local_164,"\fހ\x7f",4);
  local_160 = local_164;
  local_158 = 4;
  init_25._M_len = 4;
  init_25._M_array = local_160;
  kj::ArrayPtr<const_signed_char>::ArrayPtr(&local_150,init_25);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List((Builder *)local_58,local_150);
  local_190[0] = 0x4d2;
  local_190[1] = 0xe9d2;
  local_190[2] = 0x8000;
  local_190[3] = 0x7fff;
  local_188 = local_190;
  local_180 = 4;
  init_24._M_len = 4;
  init_24._M_array = local_188;
  kj::ArrayPtr<const_short>::ArrayPtr(&local_178,init_24);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List((Builder *)local_58,local_178);
  local_1c0[0] = 0xbc614e;
  local_1c0[1] = 0xfaa0d340;
  local_1c0[2] = 0x80000000;
  local_1c0[3] = 0x7fffffff;
  local_1b0 = local_1c0;
  local_1a8 = 4;
  init_23._M_len = 4;
  init_23._M_array = local_1b0;
  kj::ArrayPtr<const_int>::ArrayPtr(&local_1a0,init_23);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List((Builder *)local_58,local_1a0);
  local_200[0] = 0x7048860ddf79;
  local_200[1] = 0xfffd968afd13752e;
  local_200[2] = 0x8000000000000000;
  local_200[3] = 0x7fffffffffffffff;
  local_1e0 = local_200;
  local_1d8 = 4;
  init_22._M_len = 4;
  init_22._M_array = local_1e0;
  kj::ArrayPtr<const_long>::ArrayPtr(&local_1d0,init_22);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List((Builder *)local_58,local_1d0);
  local_224[0] = '\f';
  local_224[1] = 0x22;
  local_224[2] = 0;
  local_224[3] = 0xff;
  local_220 = local_224;
  local_218 = 4;
  init_21._M_len = 4;
  init_21._M_array = local_220;
  kj::ArrayPtr<const_unsigned_char>::ArrayPtr(&local_210,init_21);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List((Builder *)local_58,local_210);
  local_250[0] = 0x4d2;
  local_250[1] = 0x162e;
  local_250[2] = 0;
  local_250[3] = 0xffff;
  local_248 = local_250;
  local_240 = 4;
  init_20._M_len = 4;
  init_20._M_array = local_248;
  kj::ArrayPtr<const_unsigned_short>::ArrayPtr(&local_238,init_20);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List((Builder *)local_58,local_238);
  local_280[0] = 0xbc614e;
  local_280[1] = 0x55f2cc0;
  local_280[2] = 0;
  local_280[3] = 0xffffffff;
  local_270 = local_280;
  local_268 = 4;
  init_19._M_len = 4;
  init_19._M_array = local_270;
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(&local_260,init_19);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List((Builder *)local_58,local_260);
  local_2c0[0] = 0x7048860ddf79;
  local_2c0[1] = 0x2697502ec8ad2;
  local_2c0[2] = 0;
  local_2c0[3] = 0xffffffffffffffff;
  local_2a0 = local_2c0;
  local_298 = 4;
  init_18._M_len = 4;
  init_18._M_array = local_2a0;
  kj::ArrayPtr<const_unsigned_long>::ArrayPtr(&local_290,init_18);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List((Builder *)local_58,local_290);
  local_2f8[0] = 0.0;
  local_2f8[1] = 1234567.0;
  local_2f8[2] = 1e+37;
  local_2f8[3] = -1e+37;
  local_2f8[4] = 1e-37;
  local_2f8[5] = -1e-37;
  local_2e0 = local_2f8;
  local_2d8 = 6;
  init_17._M_len = 6;
  init_17._M_array = local_2e0;
  kj::ArrayPtr<const_float>::ArrayPtr(&local_2d0,init_17);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List((Builder *)local_58,local_2d0);
  memcpy(local_348,&DAT_00a66830,0x30);
  local_318 = local_348;
  local_310 = 6;
  init_16._M_len = 6;
  init_16._M_array = local_318;
  kj::ArrayPtr<const_double>::ArrayPtr(&local_308,init_16);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List((Builder *)local_58,local_308);
  Text::Reader::Reader(&local_398,"quux");
  Text::Reader::Reader(&RStack_388,"corge");
  Text::Reader::Reader(&RStack_378,"grault");
  local_368 = &local_398;
  local_360 = 3;
  init_15._M_len = 3;
  init_15._M_array = local_368;
  kj::ArrayPtr<const_capnp::Text::Reader>::ArrayPtr(&local_358,init_15);
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList((Builder *)local_58,local_358);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("garply");
  _::data("waldo");
  _::data("fred");
  init_14._M_len = 3;
  init_14._M_array = (iterator)&listBuilder.builder.structDataSize;
  kj::ArrayPtr<const_capnp::Data::Reader>::ArrayPtr(&local_3a8,init_14);
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList((Builder *)local_58,local_3a8);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)local_410,(Builder *)local_58,3);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_438,(Builder *)local_410,0);
  Text::Reader::Reader((Reader *)&local_448,"x structlist 1");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_438,(Reader)local_448);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_470,(Builder *)local_410,1);
  Text::Reader::Reader((Reader *)&local_480,"x structlist 2");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_470,(Reader)local_480);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_4a8,(Builder *)local_410,2);
  Text::Reader::Reader((Reader *)&local_4b8,"x structlist 3");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_4a8,(Reader)local_4b8);
  local_4de[0] = QUX;
  local_4de[1] = 1;
  local_4de[2] = 6;
  local_4d8 = local_4de;
  local_4d0 = 3;
  init_13._M_len = 3;
  init_13._M_array = local_4d8;
  kj::ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3>::ArrayPtr(&local_4c8,init_13);
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumList((Builder *)local_58,local_4c8);
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumField
            ((Builder *)&stack0x00000008,CORGE);
  capnproto_test::capnp::test::TestAllTypes::Builder::initVoidList
            (&local_508,(Builder *)&stack0x00000008,6);
  local_52c[0] = true;
  local_52c[1] = false;
  local_52c[2] = false;
  local_52c[3] = true;
  local_528 = local_52c;
  local_520 = 4;
  init_12._M_len = 4;
  init_12._M_array = local_528;
  kj::ArrayPtr<const_bool>::ArrayPtr(&local_518,init_12);
  capnproto_test::capnp::test::TestAllTypes::Builder::setBoolList
            ((Builder *)&stack0x00000008,local_518);
  local_552[0] = 'o';
  local_552[1] = 0x91;
  local_550 = local_552;
  local_548 = 2;
  init_11._M_len = 2;
  init_11._M_array = local_550;
  kj::ArrayPtr<const_signed_char>::ArrayPtr(&local_540,init_11);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt8List
            ((Builder *)&stack0x00000008,local_540);
  local_57c[0] = 0x2b67;
  local_57c[1] = 0xd499;
  local_578 = local_57c;
  local_570 = 2;
  init_10._M_len = 2;
  init_10._M_array = local_578;
  kj::ArrayPtr<const_short>::ArrayPtr(&local_568,init_10);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt16List
            ((Builder *)&stack0x00000008,local_568);
  local_5a8[0] = 0x69f6bc7;
  local_5a8[1] = 0xf9609439;
  local_5a0 = local_5a8;
  local_598 = 2;
  init_09._M_len = 2;
  init_09._M_array = local_5a0;
  kj::ArrayPtr<const_int>::ArrayPtr(&local_590,init_09);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt32List
            ((Builder *)&stack0x00000008,local_590);
  local_5d8[0] = 0xf6b75ab2bc471c7;
  local_5d8[1] = 0xf0948a54d43b8e39;
  local_5c8 = local_5d8;
  local_5c0 = 2;
  init_08._M_len = 2;
  init_08._M_array = local_5c8;
  kj::ArrayPtr<const_long>::ArrayPtr(&local_5b8,init_08);
  capnproto_test::capnp::test::TestAllTypes::Builder::setInt64List
            ((Builder *)&stack0x00000008,local_5b8);
  local_5fa[0] = 'o';
  local_5fa[1] = 0xde;
  local_5f8 = local_5fa;
  local_5f0 = 2;
  init_07._M_len = 2;
  init_07._M_array = local_5f8;
  kj::ArrayPtr<const_unsigned_char>::ArrayPtr(&local_5e8,init_07);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt8List
            ((Builder *)&stack0x00000008,local_5e8);
  local_624[0] = 0x8235;
  local_624[1] = 0xad9c;
  local_620 = local_624;
  local_618 = 2;
  init_06._M_len = 2;
  init_06._M_array = local_620;
  kj::ArrayPtr<const_unsigned_short>::ArrayPtr(&local_610,init_06);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt16List
            ((Builder *)&stack0x00000008,local_610);
  local_64c = 0xc6aea155;
  local_648 = &local_64c;
  local_640 = 1;
  init_05._M_len = 1;
  init_05._M_array = local_648;
  kj::ArrayPtr<const_unsigned_int>::ArrayPtr(&local_638,init_05);
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt32List
            ((Builder *)&stack0x00000008,local_638);
  local_678 = 0x9a3298afb5ac71c7;
  local_670 = &local_678;
  local_668 = 1;
  init_04._M_len = 1;
  init_04._M_array = local_670;
  kj::ArrayPtr<const_unsigned_long>::ArrayPtr(&local_660,init_04);
  __tagb = (Builder *)&stack0x00000008;
  capnproto_test::capnp::test::TestAllTypes::Builder::setUInt64List
            ((Builder *)&stack0x00000008,local_660);
  local_6a8 = 5555.5;
  local_6a4 = kj::inf();
  local_6a0 = kj::inf();
  local_6a0 = -local_6a0;
  dVar1 = kj::nan((char *)__tagb);
  local_69c = SUB84(dVar1,0);
  local_698 = &local_6a8;
  local_690 = 4;
  init_03._M_len = 4;
  init_03._M_array = local_698;
  kj::ArrayPtr<const_float>::ArrayPtr(&local_688,init_03);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat32List
            ((Builder *)&stack0x00000008,local_688);
  local_6e8[0] = 7777.75;
  local_6e8[1] = INFINITY;
  local_6e8[2] = -INFINITY;
  local_6e8[3] = NAN;
  local_6c8 = local_6e8;
  local_6c0 = 4;
  init_02._M_len = 4;
  init_02._M_array = local_6c8;
  kj::ArrayPtr<const_double>::ArrayPtr(&local_6b8,init_02);
  capnproto_test::capnp::test::TestAllTypes::Builder::setFloat64List
            ((Builder *)&stack0x00000008,local_6b8);
  Text::Reader::Reader(&local_738,"plugh");
  Text::Reader::Reader(&RStack_728,"xyzzy");
  Text::Reader::Reader(&RStack_718,"thud");
  local_708 = &local_738;
  local_700 = 3;
  init_01._M_len = 3;
  init_01._M_array = local_708;
  kj::ArrayPtr<const_capnp::Text::Reader>::ArrayPtr(&local_6f8,init_01);
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextList
            ((Builder *)&stack0x00000008,local_6f8);
  join_0x00000010_0x00000000_ = (ArrayPtr<const_unsigned_char>)_::data("oops");
  _::data("exhausted");
  _::data("rfc3092");
  init_00._M_len = 3;
  init_00._M_array = (iterator)&listBuilder_1.builder.structDataSize;
  kj::ArrayPtr<const_capnp::Data::Reader>::ArrayPtr(&local_748,init_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::setDataList
            ((Builder *)&stack0x00000008,local_748);
  capnproto_test::capnp::test::TestAllTypes::Builder::initStructList
            ((Builder *)local_7b0,(Builder *)&stack0x00000008,3);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_7d8,(Builder *)local_7b0,0);
  Text::Reader::Reader((Reader *)&local_7e8,"structlist 1");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_7d8,(Reader)local_7e8);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_810,(Builder *)local_7b0,1);
  Text::Reader::Reader((Reader *)&local_820,"structlist 2");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_810,(Reader)local_820);
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Builder::operator[]
            (&local_848,(Builder *)local_7b0,2);
  Text::Reader::Reader((Reader *)&local_858,"structlist 3");
  capnproto_test::capnp::test::TestAllTypes::Builder::setTextField(&local_848,(Reader)local_858);
  local_87c[0] = FOO;
  local_87c[1] = 7;
  local_878 = local_87c;
  local_870 = 2;
  init._M_len = 2;
  init._M_array = local_878;
  kj::ArrayPtr<const_capnp::schemas::TestEnum_9c8e9318b29d9cd3>::ArrayPtr(&local_868,init);
  capnproto_test::capnp::test::TestAllTypes::Builder::setEnumList
            ((Builder *)&stack0x00000008,local_868);
  return;
}

Assistant:

void genericInitTestMessage(Builder builder) {
  builder.setVoidField(VOID);
  builder.setVoidField();  // Means the same as above.
  builder.setBoolField(true);
  builder.setInt8Field(-123);
  builder.setInt16Field(-12345);
  builder.setInt32Field(-12345678);
  builder.setInt64Field(-123456789012345ll);
  builder.setUInt8Field(234u);
  builder.setUInt16Field(45678u);
  builder.setUInt32Field(3456789012u);
  builder.setUInt64Field(12345678901234567890ull);
  builder.setFloat32Field(1234.5);
  builder.setFloat64Field(-123e45);
  builder.setTextField("foo");
  builder.setDataField(data("bar"));
  {
    auto subBuilder = builder.initStructField();
    subBuilder.setVoidField(VOID);
    subBuilder.setBoolField(true);
    subBuilder.setInt8Field(-12);
    subBuilder.setInt16Field(3456);
    subBuilder.setInt32Field(-78901234);
    subBuilder.setInt64Field(56789012345678ll);
    subBuilder.setUInt8Field(90u);
    subBuilder.setUInt16Field(1234u);
    subBuilder.setUInt32Field(56789012u);
    subBuilder.setUInt64Field(345678901234567890ull);
    subBuilder.setFloat32Field(-1.25e-10f);
    subBuilder.setFloat64Field(345);
    subBuilder.setTextField("baz");
    subBuilder.setDataField(data("qux"));
    {
      auto subSubBuilder = subBuilder.initStructField();
      subSubBuilder.setTextField("nested");
      subSubBuilder.initStructField().setTextField("really nested");
    }
    subBuilder.setEnumField(TestEnum::BAZ);

    subBuilder.setVoidList({VOID, VOID, VOID});
    subBuilder.setBoolList({false, true, false, true, true});
    subBuilder.setInt8List({12, -34, -0x80, 0x7f});
    subBuilder.setInt16List({1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    subBuilder.setInt32List({12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    subBuilder.setInt64List({123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    subBuilder.setUInt8List({12u, 34u, 0u, 0xffu});
    subBuilder.setUInt16List({1234u, 5678u, 0u, 0xffffu});
    subBuilder.setUInt32List({12345678u, 90123456u, 0u, 0xffffffffu});
    subBuilder.setUInt64List({123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    subBuilder.setFloat32List({0, 1234567, 1e37f, -1e37f, 1e-37f, -1e-37f});
    subBuilder.setFloat64List({0, 123456789012345, 1e306, -1e306, 1e-306, -1e-306});
    subBuilder.setTextList({"quux", "corge", "grault"});
    subBuilder.setDataList({data("garply"), data("waldo"), data("fred")});
    {
      auto listBuilder = subBuilder.initStructList(3);
      listBuilder[0].setTextField("x structlist 1");
      listBuilder[1].setTextField("x structlist 2");
      listBuilder[2].setTextField("x structlist 3");
    }
    subBuilder.setEnumList({TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  builder.setEnumField(TestEnum::CORGE);

  builder.initVoidList(6);
  builder.setBoolList({true, false, false, true});
  builder.setInt8List({111, -111});
  builder.setInt16List({11111, -11111});
  builder.setInt32List({111111111, -111111111});
  builder.setInt64List({1111111111111111111ll, -1111111111111111111ll});
  builder.setUInt8List({111u, 222u});
  builder.setUInt16List({33333u, 44444u});
  builder.setUInt32List({3333333333u});
  builder.setUInt64List({11111111111111111111ull});
  builder.setFloat32List({5555.5, kj::inf(), -kj::inf(), kj::nan()});
  builder.setFloat64List({7777.75, kj::inf(), -kj::inf(), kj::nan()});
  builder.setTextList({"plugh", "xyzzy", "thud"});
  builder.setDataList({data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listBuilder = builder.initStructList(3);
    listBuilder[0].setTextField("structlist 1");
    listBuilder[1].setTextField("structlist 2");
    listBuilder[2].setTextField("structlist 3");
  }
  builder.setEnumList({TestEnum::FOO, TestEnum::GARPLY});
}